

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O0

void __thiscall rengine::StandardSurface::~StandardSurface(StandardSurface *this)

{
  bool bVar1;
  pointer pRVar2;
  Node *pNVar3;
  StandardSurface *this_local;
  
  (this->super_Surface)._vptr_Surface = (_func_int **)&PTR__StandardSurface_0014d900;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_renderer);
  if (bVar1) {
    pRVar2 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::operator->
                       (&this->m_renderer);
    pNVar3 = Renderer::sceneRoot(pRVar2);
    if (pNVar3 != (Node *)0x0) {
      pRVar2 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
               operator->(&this->m_renderer);
      pNVar3 = Renderer::sceneRoot(pRVar2);
      (*(pNVar3->super_SignalEmitter)._vptr_SignalEmitter[2])();
    }
  }
  WorkQueue::~WorkQueue(&this->m_workQueue);
  AnimationManager::~AnimationManager(&this->m_animationManager);
  std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::~unique_ptr
            (&this->m_renderer);
  Surface::~Surface(&this->super_Surface);
  return;
}

Assistant:

~StandardSurface()
    {
        if (m_renderer) {
            if (m_renderer->sceneRoot())
                m_renderer->sceneRoot()->destroy();
        }
    }